

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O0

int argize(char *cmdline,int *argc,char **argv,size_t argvlen)

{
  int iVar1;
  ushort **ppuVar2;
  ulong in_RCX;
  long in_RDX;
  int *in_RSI;
  byte *in_RDI;
  int state;
  char *q;
  char *p;
  undefined4 local_3c;
  byte *local_38;
  byte *local_30;
  
  *in_RSI = 0;
  local_3c = 0;
  local_38 = in_RDI;
  local_30 = in_RDI;
  do {
    if (*local_30 == 0) {
      *local_38 = 0;
      return 0;
    }
    switch(local_3c) {
    case 0:
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)*local_30] & 0x2000) != 0) {
        local_30 = local_30 + 1;
        local_38 = local_38 + 1;
      }
      if (*local_30 == 0) break;
    case 1:
      if (in_RCX <= (ulong)(long)*in_RSI) {
        return 1;
      }
      iVar1 = *in_RSI;
      *in_RSI = iVar1 + 1;
      *(byte **)(in_RDX + (long)iVar1 * 8) = local_38;
      local_3c = 2;
switchD_00246f6e_caseD_2:
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)*local_30] & 0x2000) == 0) {
        if (*local_30 == 0x22) {
          local_3c = 3;
        }
        else if (*local_30 == 0x5c) {
          local_3c = 4;
        }
        else {
          *local_38 = *local_30;
          local_38 = local_38 + 1;
        }
      }
      else {
        *local_30 = 0;
        *local_38 = 0;
        local_3c = 0;
        local_38 = local_38 + 1;
      }
      local_30 = local_30 + 1;
      break;
    case 2:
      goto switchD_00246f6e_caseD_2;
    case 3:
      if (*local_30 == 0x22) {
        local_3c = 2;
      }
      else if (*local_30 == 0x5c) {
        local_3c = 5;
      }
      else {
        *local_38 = *local_30;
        local_38 = local_38 + 1;
      }
      local_30 = local_30 + 1;
      break;
    case 4:
      *local_38 = *local_30;
      local_3c = 2;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
      break;
    case 5:
      *local_38 = *local_30;
      local_3c = 3;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
    }
  } while( true );
}

Assistant:

int argize(char *cmdline, int *const argc, char *argv[], const size_t argvlen)
{
    char   *p, *q;
    int             state;

    p = q = cmdline;
    *argc = 0;
    state = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++, q++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            if ((size_t)*argc < argvlen)
                argv[(*argc)++] = q;
            else
                return 1;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                *q++ = *p++ = '\0', state = 0;        /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                *q++ = *p++;                            /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote.*/
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   *q++ = *p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            *q++ = *p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            *q++ = *p++; state = 3;
            break;
        }
    }
    *q = '\0';
    return 0;
}